

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbolic_invert.cc
# Opt level: O0

vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
* ipx::Blockperm(SparseMatrix *AI,vector<int,_std::allocator<int>_> *jmatch,SparseMatrix *BT)

{
  Int IVar1;
  Int *Ai_00;
  Int *Ap_00;
  bool bVar2;
  reference pvVar3;
  int *piVar4;
  int *istack_00;
  reference piVar5;
  SparseMatrix *in_RSI;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *in_RDI;
  Int end;
  Int i_1;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  vector<int,_std::allocator<int>_> rowperm;
  Int i;
  Int top;
  vector<int,_std::allocator<int>_> work;
  vector<int,_std::allocator<int>_> marked;
  vector<int,_std::allocator<int>_> istack;
  Int *BTi;
  Int *BTp;
  Int *Ai;
  Int *Ap;
  Int m;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *blocks;
  allocator_type *in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc4;
  __normal_iterator<std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
  in_stack_fffffffffffffdc8;
  __normal_iterator<std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
  in_stack_fffffffffffffdd0;
  size_type in_stack_fffffffffffffdd8;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffde0;
  allocator_type *__a;
  undefined4 in_stack_fffffffffffffdf0;
  int iVar6;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_f0;
  undefined1 *local_e8;
  byte local_bd;
  int local_bc;
  Int local_b8;
  vector<int,_std::allocator<int>_> local_90 [2];
  undefined1 local_60 [24];
  Int *local_48;
  Int *local_40;
  Int *local_38;
  Int *local_30;
  Int local_24;
  
  local_24 = SparseMatrix::rows(in_RSI);
  local_30 = SparseMatrix::colptr((SparseMatrix *)0x8528ab);
  local_38 = SparseMatrix::rowidx((SparseMatrix *)0x8528c0);
  local_40 = SparseMatrix::colptr((SparseMatrix *)0x8528d5);
  local_48 = SparseMatrix::rowidx((SparseMatrix *)0x8528ea);
  std::allocator<int>::allocator((allocator<int> *)0x852917);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
             (allocator_type *)in_stack_fffffffffffffdd0._M_current);
  std::allocator<int>::~allocator((allocator<int> *)0x852943);
  std::allocator<int>::allocator((allocator<int> *)0x852968);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
             (allocator_type *)in_stack_fffffffffffffdd0._M_current);
  std::allocator<int>::~allocator((allocator<int> *)0x852994);
  std::allocator<int>::allocator((allocator<int> *)0x8529b9);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
             (allocator_type *)in_stack_fffffffffffffdd0._M_current);
  std::allocator<int>::~allocator((allocator<int> *)0x8529e5);
  local_b8 = local_24;
  for (local_bc = 0; local_bc < local_24; local_bc = local_bc + 1) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](local_90,(long)local_bc);
    Ap_00 = local_30;
    Ai_00 = local_38;
    iVar6 = local_bc;
    if (*pvVar3 != 1) {
      piVar4 = std::vector<int,_std::allocator<int>_>::data
                         ((vector<int,_std::allocator<int>_> *)0x852a6b);
      IVar1 = local_b8;
      istack_00 = std::vector<int,_std::allocator<int>_>::data
                            ((vector<int,_std::allocator<int>_> *)0x852a8e);
      in_stack_fffffffffffffdb8 =
           (allocator_type *)
           std::vector<int,_std::allocator<int>_>::data
                     ((vector<int,_std::allocator<int>_> *)0x852aa3);
      in_stack_fffffffffffffdc8._M_current =
           (vector<int,_std::allocator<int>_> *)
           std::vector<int,_std::allocator<int>_>::data
                     ((vector<int,_std::allocator<int>_> *)0x852ab5);
      in_stack_fffffffffffffdc0 = 1;
      local_b8 = DepthFirstSearch(iVar6,Ap_00,Ai_00,piVar4,IVar1,istack_00,
                                  (Int *)in_stack_fffffffffffffdb8,1,
                                  (Int *)in_stack_fffffffffffffdc8._M_current);
    }
  }
  local_bd = 0;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)0x852bd6);
  std::allocator<int>::allocator((allocator<int> *)0x852bf5);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
             (allocator_type *)in_stack_fffffffffffffdd0._M_current);
  std::allocator<int>::~allocator((allocator<int> *)0x852c1b);
  local_b8 = local_24;
  local_e8 = local_60;
  local_f0._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdb8);
  std::vector<int,_std::allocator<int>_>::end
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdb8);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_fffffffffffffdb8);
    if (!bVar2) break;
    piVar5 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&local_f0);
    iVar6 = *piVar5;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](local_90,(long)iVar6);
    IVar1 = local_b8;
    if (*pvVar3 != 2) {
      __last._M_current = local_40;
      __first._M_current = local_48;
      piVar4 = std::vector<int,_std::allocator<int>_>::data
                         ((vector<int,_std::allocator<int>_> *)0x852d00);
      in_stack_fffffffffffffdb8 =
           (allocator_type *)
           std::vector<int,_std::allocator<int>_>::data
                     ((vector<int,_std::allocator<int>_> *)0x852d12);
      in_stack_fffffffffffffdc8._M_current =
           (vector<int,_std::allocator<int>_> *)
           std::vector<int,_std::allocator<int>_>::data
                     ((vector<int,_std::allocator<int>_> *)0x852d24);
      in_stack_fffffffffffffdc0 = 2;
      __a = in_stack_fffffffffffffdb8;
      local_b8 = DepthFirstSearch(iVar6,__last._M_current,__first._M_current,(Int *)0x0,IVar1,piVar4
                                  ,(Int *)in_stack_fffffffffffffdb8,2,
                                  (Int *)in_stack_fffffffffffffdc8._M_current);
      std::vector<int,_std::allocator<int>_>::begin
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdb8);
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                 in_stack_fffffffffffffdc8._M_current,
                 CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
      std::vector<int,_std::allocator<int>_>::begin
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdb8);
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                 in_stack_fffffffffffffdc8._M_current,
                 CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
      std::allocator<int>::allocator((allocator<int> *)0x852de7);
      std::vector<int,std::allocator<int>>::
      vector<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
                ((vector<int,_std::allocator<int>_> *)CONCAT44(iVar6,in_stack_fffffffffffffdf0),
                 __first,__last,__a);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::push_back((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                  (value_type *)in_stack_fffffffffffffdb8);
      std::vector<int,_std::allocator<int>_>::~vector(in_stack_fffffffffffffdd0._M_current);
      std::allocator<int>::~allocator((allocator<int> *)0x852e3c);
    }
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_f0);
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::begin((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           *)in_stack_fffffffffffffdb8);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::end((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         *)in_stack_fffffffffffffdb8);
  std::
  reverse<__gnu_cxx::__normal_iterator<std::vector<int,std::allocator<int>>*,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>
            (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  local_bd = 1;
  std::vector<int,_std::allocator<int>_>::~vector(in_stack_fffffffffffffdd0._M_current);
  if ((local_bd & 1) == 0) {
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)in_stack_fffffffffffffdd0._M_current);
  }
  std::vector<int,_std::allocator<int>_>::~vector(in_stack_fffffffffffffdd0._M_current);
  std::vector<int,_std::allocator<int>_>::~vector(in_stack_fffffffffffffdd0._M_current);
  std::vector<int,_std::allocator<int>_>::~vector(in_stack_fffffffffffffdd0._M_current);
  return in_RDI;
}

Assistant:

static std::vector<std::vector<Int> >
Blockperm(const SparseMatrix& AI, const std::vector<Int>& jmatch,
          const SparseMatrix& BT) {
    const Int m = AI.rows();
    const Int* Ap = AI.colptr();
    const Int* Ai = AI.rowidx();
    const Int* BTp = BT.colptr();
    const Int* BTi = BT.rowidx();

    // Put row indices into istack, working from the bottom of the stack (m-1)
    // to the top (0), so that indices whose depth-first search finished first
    // appear further down the stack.
    std::vector<Int> istack(m), marked(m), work(m);
    Int top = m;
    for (Int i = 0; i < m; i++) {
        if (marked[i] != 1)
            top = DepthFirstSearch(i, Ap, Ai, jmatch.data(), top, istack.data(),
                                   marked.data(), 1, work.data());
    }
    assert(top == 0);

    std::vector<std::vector<Int> > blocks;
    std::vector<Int> rowperm(m);
    top = m;
    for (Int i : istack) {
        if (marked[i] != 2) {
            // Node i is not part of any block yet.
            Int end = top;
            top = DepthFirstSearch(i, BTp, BTi, nullptr, top, rowperm.data(),
                                   marked.data(), 2, work.data());
            assert(top < end);
            blocks.push_back(std::vector<Int>(rowperm.begin() + top,
                                              rowperm.begin() + end));
        }
    }
    assert(top == 0);
    std::reverse(blocks.begin(), blocks.end());
    return blocks;
}